

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QAccessibleInterface * __thiscall
QAccessibleMainWindow::childAt(QAccessibleMainWindow *this,int x,int y)

{
  bool bVar1;
  QWidget *pQVar2;
  QPoint *pos;
  const_iterator o;
  QWidget **ppQVar3;
  QRect *pQVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  QWidget *child;
  QWidgetList *__range1;
  QWidget *w;
  const_iterator __end1;
  const_iterator __begin1;
  QPoint rp;
  QWidgetList kids;
  QPoint gp;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QWidget *in_stack_ffffffffffffff30;
  QRect *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  QAccessibleInterface *local_70;
  const_iterator local_58 [2];
  QPoint local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QAccessibleWidget::widget((QAccessibleWidget *)0x7e91b8);
  bVar1 = QWidget::isVisible((QWidget *)0x7e91c7);
  if (bVar1) {
    local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QPoint::QPoint((QPoint *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                   in_stack_ffffffffffffff28);
    local_10 = QWidget::mapToGlobal(pQVar2,(QPoint *)in_stack_ffffffffffffff38);
    QPoint::x((QPoint *)0x7e922a);
    QPoint::y((QPoint *)0x7e923b);
    QWidget::width((QWidget *)0x7e9249);
    QWidget::height((QWidget *)0x7e9257);
    QRect::QRect(in_stack_ffffffffffffff38,(int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                 (int)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
    ;
    bVar1 = QRect::contains((QRect *)pQVar2,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                            (int)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      mainWindow((QAccessibleMainWindow *)0x7e92d5);
      _q_ac_childWidgets((QWidget *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_48 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      pos = (QPoint *)mainWindow((QAccessibleMainWindow *)0x7e92fe);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                     in_stack_ffffffffffffff28);
      local_48 = QWidget::mapFromGlobal(pQVar2,pos);
      local_58[0].i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      local_58[0] = QList<QWidget_*>::begin((QList<QWidget_*> *)in_stack_ffffffffffffff30);
      o = QList<QWidget_*>::end((QList<QWidget_*> *)in_stack_ffffffffffffff30);
      while (bVar1 = QList<QWidget_*>::const_iterator::operator!=(local_58,o), bVar1) {
        ppQVar3 = QList<QWidget_*>::const_iterator::operator*(local_58);
        pQVar2 = *ppQVar3;
        bVar1 = QWidget::isWindow(in_stack_ffffffffffffff30);
        if ((!bVar1) && (bVar1 = QWidget::isHidden((QWidget *)0x7e93dc), !bVar1)) {
          pQVar4 = QWidget::geometry(pQVar2);
          uVar5 = QRect::contains((QPoint *)pQVar4,SUB81(&local_48,0));
          if ((uVar5 & 1) != 0) {
            local_70 = (QAccessibleInterface *)
                       QAccessible::queryAccessibleInterface(&pQVar2->super_QObject);
            goto LAB_007e9440;
          }
        }
        QList<QWidget_*>::const_iterator::operator++(local_58);
      }
      local_70 = (QAccessibleInterface *)0x0;
LAB_007e9440:
      QList<QWidget_*>::~QList((QList<QWidget_*> *)0x7e944d);
    }
    else {
      local_70 = (QAccessibleInterface *)0x0;
    }
  }
  else {
    local_70 = (QAccessibleInterface *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_70;
}

Assistant:

QAccessibleInterface *QAccessibleMainWindow::childAt(int x, int y) const
{
    QWidget *w = widget();
    if (!w->isVisible())
        return nullptr;
    QPoint gp = w->mapToGlobal(QPoint(0, 0));
    if (!QRect(gp.x(), gp.y(), w->width(), w->height()).contains(x, y))
        return nullptr;

    const QWidgetList kids = _q_ac_childWidgets(mainWindow());
    QPoint rp = mainWindow()->mapFromGlobal(QPoint(x, y));
    for (QWidget *child : kids) {
        if (!child->isWindow() && !child->isHidden() && child->geometry().contains(rp)) {
            return QAccessible::queryAccessibleInterface(child);
        }
    }
    return nullptr;
}